

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_limit_percent.cpp
# Opt level: O0

SourceResultType __thiscall
duckdb::PhysicalLimitPercent::GetData
          (PhysicalLimitPercent *this,ExecutionContext *context,DataChunk *chunk,
          OperatorSourceInput *input)

{
  bool bVar1;
  LimitPercentGlobalState *pLVar2;
  LimitPercentOperatorState *pLVar3;
  double *pdVar4;
  optional_idx *this_00;
  idx_t *piVar5;
  idx_t iVar6;
  undefined8 uVar7;
  ulong uVar8;
  double dVar9;
  undefined1 auVar10 [16];
  idx_t limit_percentage;
  idx_t count;
  idx_t *current_offset;
  optional_idx *limit;
  optional_idx *offset;
  double *percent_limit;
  LimitPercentOperatorState *state;
  LimitPercentGlobalState *gstate;
  string *in_stack_ffffffffffffff18;
  GlobalSinkState *in_stack_ffffffffffffff20;
  DataChunk *in_stack_ffffffffffffff38;
  ColumnDataScanState *in_stack_ffffffffffffff40;
  allocator *paVar11;
  optional_idx in_stack_ffffffffffffff48;
  idx_t local_b0;
  idx_t in_stack_ffffffffffffff58;
  optional_idx *in_stack_ffffffffffffff60;
  allocator local_81;
  idx_t in_stack_ffffffffffffff80;
  idx_t in_stack_ffffffffffffff88;
  idx_t *in_stack_ffffffffffffff90;
  DataChunk *in_stack_ffffffffffffff98;
  optional_idx *local_60;
  SourceResultType local_1;
  
  unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>::
  operator->((unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
              *)in_stack_ffffffffffffff20);
  pLVar2 = GlobalSinkState::Cast<duckdb::LimitPercentGlobalState>(in_stack_ffffffffffffff20);
  pLVar3 = GlobalSourceState::Cast<duckdb::LimitPercentOperatorState>
                     ((GlobalSourceState *)in_stack_ffffffffffffff20);
  pdVar4 = &pLVar2->limit_percent;
  this_00 = &pLVar3->limit;
  bVar1 = optional_idx::IsValid(this_00);
  if (!bVar1) {
    if ((pLVar2->is_limit_set & 1U) == 0) {
      return FINISHED;
    }
    piVar5 = ColumnDataCollection::Count(&pLVar2->data);
    local_60 = (optional_idx *)*piVar5;
    if (local_60 != (optional_idx *)0x0) {
      iVar6 = optional_idx::GetIndex(in_stack_ffffffffffffff60);
      local_60 = (optional_idx *)((long)&local_60->index + iVar6);
    }
    bVar1 = Value::IsNan<double>(1.2377725835869e-316);
    if (((bVar1) || (*pdVar4 <= 0.0 && *pdVar4 != 0.0)) || (100.0 < *pdVar4)) {
      uVar7 = __cxa_allocate_exception(0x10);
      paVar11 = &local_81;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&stack0xffffffffffffff80,
                 "Limit percent out of range, should be between 0% and 100%",paVar11);
      OutOfRangeException::OutOfRangeException
                ((OutOfRangeException *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      __cxa_throw(uVar7,&OutOfRangeException::typeinfo,OutOfRangeException::~OutOfRangeException);
    }
    auVar10._8_4_ = (int)((ulong)local_60 >> 0x20);
    auVar10._0_8_ = local_60;
    auVar10._12_4_ = 0x45300000;
    dVar9 = (*pdVar4 / 100.0) *
            ((auVar10._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)local_60) - 4503599627370496.0));
    uVar8 = (ulong)dVar9;
    in_stack_ffffffffffffff60 =
         (optional_idx *)(uVar8 | (long)(dVar9 - 9.223372036854776e+18) & (long)uVar8 >> 0x3f);
    if (local_60 < in_stack_ffffffffffffff60) {
      optional_idx::optional_idx(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      this_00->index = in_stack_ffffffffffffff58;
    }
    else {
      optional_idx::optional_idx(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      this_00->index = local_b0;
    }
    optional_idx::optional_idx(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    bVar1 = optional_idx::operator==(this_00,(optional_idx *)&stack0xffffffffffffff48);
    if (bVar1) {
      return FINISHED;
    }
  }
  uVar8 = pLVar3->current_offset;
  iVar6 = optional_idx::GetIndex(in_stack_ffffffffffffff60);
  if (uVar8 < iVar6) {
    bVar1 = ColumnDataCollection::Scan
                      ((ColumnDataCollection *)in_stack_ffffffffffffff48.index,
                       in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    if (bVar1) {
      optional_idx::GetIndex(in_stack_ffffffffffffff60);
      PhysicalLimit::HandleOffset
                (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                 in_stack_ffffffffffffff80);
      local_1 = HAVE_MORE_OUTPUT;
    }
    else {
      local_1 = FINISHED;
    }
  }
  else {
    local_1 = FINISHED;
  }
  return local_1;
}

Assistant:

SourceResultType PhysicalLimitPercent::GetData(ExecutionContext &context, DataChunk &chunk,
                                               OperatorSourceInput &input) const {
	auto &gstate = sink_state->Cast<LimitPercentGlobalState>();
	auto &state = input.global_state.Cast<LimitPercentOperatorState>();
	auto &percent_limit = gstate.limit_percent;
	auto &offset = gstate.offset;
	auto &limit = state.limit;
	auto &current_offset = state.current_offset;

	if (!limit.IsValid()) {
		if (!gstate.is_limit_set) {
			// no limit value and we have not set limit_percent
			// we are running LIMIT % with a subquery over an empty table
			D_ASSERT(gstate.data.Count() == 0);
			return SourceResultType::FINISHED;
		}
		idx_t count = gstate.data.Count();
		if (count > 0) {
			count += offset.GetIndex();
		}
		if (Value::IsNan(percent_limit) || percent_limit < 0 || percent_limit > 100) {
			throw OutOfRangeException("Limit percent out of range, should be between 0% and 100%");
		}
		auto limit_percentage = idx_t(percent_limit / 100.0 * double(count));
		if (limit_percentage > count) {
			limit = count;
		} else {
			limit = idx_t(limit_percentage);
		}
		if (limit == 0) {
			return SourceResultType::FINISHED;
		}
	}

	if (current_offset >= limit.GetIndex()) {
		return SourceResultType::FINISHED;
	}
	if (!gstate.data.Scan(state.scan_state, chunk)) {
		return SourceResultType::FINISHED;
	}

	PhysicalLimit::HandleOffset(chunk, current_offset, 0, limit.GetIndex());

	return SourceResultType::HAVE_MORE_OUTPUT;
}